

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateConstructorCode
          (SingularString *this,Printer *p)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  char *pcVar5;
  undefined1 auStack_38 [8];
  undefined8 uStack_30;
  undefined1 local_20 [16];
  
  bVar1 = (this->super_FieldGeneratorBase).is_inlined_;
  if (((bVar1 != true) ||
      (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) != 0)) &&
     ((this->super_FieldGeneratorBase).is_oneof_ == false)) {
    if (bVar1 != false) {
      puVar4 = local_20;
      uStack_30 = 0x1b6981;
      (anonymous_namespace)::SingularString::GenerateConstructorCode();
      if (puVar4[0x49] != '\x01') {
        if (puVar4[0x40] == '\0') {
          pcVar5 = "\n    this_.$field_$.Destroy();\n  ";
          uVar3 = 0x21;
        }
        else {
          pcVar5 = "\n      $cached_split_ptr$->$name$_.Destroy();\n    ";
          uVar3 = 0x32;
        }
        google::protobuf::io::Printer::Emit(p,0,0,uVar3,pcVar5);
        return;
      }
      if (puVar4[0x40] == '\0') {
        return;
      }
      puVar4 = auStack_38;
      (anonymous_namespace)::SingularString::GenerateDestructorCode();
      if (puVar4[0x49] == '\x01') {
        google::protobuf::io::Printer::Emit
                  (p,0,0,0x6c,
                   "\n      if (!_this->_internal_$name$_donated()) {\n        _this->$field_$.~InlinedStringField();\n      }\n    "
                  );
        return;
      }
      return;
    }
    uStack_30 = 0x1b6922;
    google::protobuf::io::Printer::Emit(p,0,0,0x1f,"\n    $field_$.InitDefault();\n  ");
    if (*(int *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                (ulong)(byte)(this->super_FieldGeneratorBase).field_[2] * 4) == 9) {
      uStack_30 = 0x1b693c;
      iVar2 = google::protobuf::FieldDescriptor::cpp_string_type();
      if ((iVar2 != 2) &&
         (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) == 0)) {
        google::protobuf::io::Printer::Emit
                  (p,0,0,0x6b,
                   "\n      if ($pbi$::DebugHardenForceCopyDefaultString()) {\n        $field_$.Set(\"\", GetArena());\n      }\n    "
                  );
        return;
      }
    }
  }
  return;
}

Assistant:

void SingularString::GenerateConstructorCode(io::Printer* p) const {
  if ((is_inlined() && EmptyDefault()) || is_oneof()) return;
  ABSL_DCHECK(!is_inlined());

  p->Emit(R"cc(
    $field_$.InitDefault();
  )cc");

  if (IsString(field_) && EmptyDefault()) {
    p->Emit(R"cc(
      if ($pbi$::DebugHardenForceCopyDefaultString()) {
        $field_$.Set("", GetArena());
      }
    )cc");
  }
}